

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::MakeCheckOpValueString<signed_char>(ostream *os,char *v)

{
  ostream *poVar1;
  char local_19;
  
  if ((byte)(*v + 0x81U) < 0xa1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"signed char value ",0x12);
    std::ostream::operator<<(os,(short)*v);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  local_19 = *v;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream* os, const signed char& v) {
  if (v >= 32 && v <= 126) {
    (*os) << "'" << v << "'";
  } else {
    (*os) << "signed char value " << (short)v;
  }
}